

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

void __thiscall
dxil_spv_converter_s::dxil_spv_converter_s
          (dxil_spv_converter_s *this,LLVMBCParser *bc_parser_,LLVMBCParser *bc_reflection_parser_)

{
  bool *local_40;
  uint32_t *local_28;
  LLVMBCParser *bc_reflection_parser__local;
  LLVMBCParser *bc_parser__local;
  dxil_spv_converter_s *this_local;
  
  this->bc_parser = bc_parser_;
  this->bc_reflection_parser = bc_reflection_parser_;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&this->spirv);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&this->entry_point);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&this->compiled_entry_point);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&this->analysis_warnings);
  Remapper::Remapper(&this->remapper);
  std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>::vector
            (&this->local_root_parameters);
  std::
  vector<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
  ::vector(&this->options);
  std::
  vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ::vector(&this->local_entries);
  this->active_table = false;
  this->uses_subgroup_size = false;
  local_28 = this->workgroup_size;
  do {
    *local_28 = 0;
    local_28 = local_28 + 1;
  } while (local_28 != &this->patch_vertex_count);
  this->patch_vertex_count = 0;
  this->wave_size_min = 0;
  this->wave_size_max = 0;
  this->wave_size_preferred = 0;
  this->heuristic_wave_size = 0;
  local_40 = this->shader_feature_used;
  do {
    *local_40 = false;
    local_40 = local_40 + 1;
  } while (local_40 != (bool *)&this->field_0x185);
  return;
}

Assistant:

dxil_spv_converter_s(LLVMBCParser &bc_parser_, LLVMBCParser *bc_reflection_parser_)
		: bc_parser(bc_parser_), bc_reflection_parser(bc_reflection_parser_)
	{
	}